

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_base.h
# Opt level: O2

Ptr __thiscall core::TypedImageBase<int>::duplicate_base(TypedImageBase<int> *this)

{
  TypedImageBase<int> *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  TypedImageBase<int> *in_RSI;
  Ptr PVar1;
  
  this_00 = (TypedImageBase<int> *)operator_new(0x30);
  TypedImageBase(this_00,in_RSI);
  std::__shared_ptr<core::ImageBase,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<core::TypedImageBase<int>,void>
            ((__shared_ptr<core::ImageBase,(__gnu_cxx::_Lock_policy)2> *)this,this_00);
  PVar1.super___shared_ptr<core::ImageBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar1.super___shared_ptr<core::ImageBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &this->super_ImageBase;
  return (Ptr)PVar1.super___shared_ptr<core::ImageBase,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

inline ImageBase::Ptr
TypedImageBase<T>::duplicate_base (void) const
{
    return ImageBase::Ptr(new TypedImageBase<T>(*this));
}